

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O1

void nni_id_map_sys_fini(void)

{
  nni_id_map *pnVar1;
  long lVar2;
  
  nni_mtx_lock(&id_reg_mtx);
  if (0 < id_reg_num) {
    lVar2 = 0;
    do {
      pnVar1 = id_reg_map[lVar2];
      if ((pnVar1 != (nni_id_map *)0x0) && (pnVar1->id_entries != (nni_id_entry *)0x0)) {
        nni_free(pnVar1->id_entries,(ulong)pnVar1->id_cap * 0x18);
        pnVar1->id_entries = (nni_id_entry *)0x0;
        pnVar1->id_cap = 0;
        pnVar1->id_count = 0;
        pnVar1->id_load = 0;
        pnVar1->id_min_load = 0;
        pnVar1->id_max_load = 0;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < id_reg_num);
  }
  nni_free(id_reg_map,(long)id_reg_len << 3);
  id_reg_map = (nni_id_map **)0x0;
  id_reg_len = 0;
  id_reg_num = 0;
  nni_mtx_unlock(&id_reg_mtx);
  return;
}

Assistant:

void
nni_id_map_sys_fini(void)
{
	nni_mtx_lock(&id_reg_mtx);
	for (int i = 0; i < id_reg_num; i++) {
		if (id_reg_map[i] != NULL) {
			nni_id_map_fini(id_reg_map[i]);
		}
	}
	nni_free(id_reg_map, sizeof(nni_id_map *) * id_reg_len);
	id_reg_map = NULL;
	id_reg_len = 0;
	id_reg_num = 0;
	nni_mtx_unlock(&id_reg_mtx);
}